

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O3

void __thiscall Architecture::~Architecture(Architecture *this)

{
  Database *this_00;
  OptionDatabase *this_01;
  pointer pPVar1;
  pointer pcVar2;
  pointer ppTVar3;
  pointer ppRVar4;
  pointer ppPVar5;
  _Rb_tree_node_base *p_Var6;
  pointer ppRVar7;
  pointer ppPVar8;
  pointer ppTVar9;
  ulong uVar10;
  long lVar11;
  
  (this->super_AddrSpaceManager)._vptr_AddrSpaceManager = (_func_int **)&PTR__Architecture_003bde78;
  ppTVar3 = (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar9 = (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar9 != ppTVar3; ppTVar9 = ppTVar9 + 1) {
    if (*ppTVar9 != (TypeOp *)0x0) {
      (*(*ppTVar9)->_vptr_TypeOp[4])();
      ppTVar3 = (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  ppRVar4 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar7 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar7 != ppRVar4) {
    uVar10 = 0;
    do {
      if (ppRVar4[uVar10] != (Rule *)0x0) {
        (*ppRVar4[uVar10]->_vptr_Rule[1])();
        ppRVar4 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppRVar7 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)ppRVar7 - (long)ppRVar4 >> 3));
  }
  this_00 = this->symboltab;
  if (this_00 != (Database *)0x0) {
    Database::~Database(this_00);
  }
  operator_delete(this_00);
  ppPVar5 = (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar8 = (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppPVar8 - (long)ppPVar5) >> 3)) {
    lVar11 = 0;
    do {
      if (ppPVar5[lVar11] != (PrintLanguage *)0x0) {
        (*ppPVar5[lVar11]->_vptr_PrintLanguage[0x11])();
        ppPVar5 = (this->printlist).
                  super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppPVar8 = (this->printlist).
                  super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)ppPVar8 - (long)ppPVar5) >> 3));
  }
  this_01 = this->options;
  if (this_01 != (OptionDatabase *)0x0) {
    OptionDatabase::~OptionDatabase(this_01);
  }
  operator_delete(this_01);
  for (p_Var6 = (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->protoModels)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if (*(long **)(p_Var6 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var6 + 2) + 8))();
    }
  }
  if (this->types != (TypeFactory *)0x0) {
    (*this->types->_vptr_TypeFactory[2])();
  }
  if (this->translate != (Translate *)0x0) {
    (*(this->translate->super_AddrSpaceManager)._vptr_AddrSpaceManager[1])();
  }
  if (this->loader != (LoadImage *)0x0) {
    (*this->loader->_vptr_LoadImage[1])();
  }
  if (this->pcodeinjectlib != (PcodeInjectLibrary *)0x0) {
    (*this->pcodeinjectlib->_vptr_PcodeInjectLibrary[3])();
  }
  if (this->commentdb != (CommentDatabase *)0x0) {
    (*this->commentdb->_vptr_CommentDatabase[1])();
  }
  if (this->cpool != (ConstantPool *)0x0) {
    (*this->cpool->_vptr_ConstantPool[2])();
  }
  if (this->context != (ContextDatabase *)0x0) {
    (*this->context->_vptr_ContextDatabase[7])();
  }
  ActionDatabase::~ActionDatabase(&this->allacts);
  pPVar1 = (this->splitrecords).
           super__Vector_base<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  UserOpManage::~UserOpManage(&this->userops);
  ppTVar9 = (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar9 != (pointer)0x0) {
    operator_delete(ppTVar9);
  }
  ppPVar5 = (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar5 != (pointer)0x0) {
    operator_delete(ppPVar5);
  }
  std::_Rb_tree<Range,_Range,_std::_Identity<Range>,_std::less<Range>,_std::allocator<Range>_>::
  ~_Rb_tree((_Rb_tree<Range,_Range,_std::_Identity<Range>,_std::less<Range>,_std::allocator<Range>_>
             *)&this->nohighptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>_>
  ::~_Rb_tree(&(this->protoModels)._M_t);
  ppRVar4 = (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar4 != (pointer)0x0) {
    operator_delete(ppRVar4);
  }
  pcVar2 = (this->archid)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->archid).field_2) {
    operator_delete(pcVar2);
  }
  AddrSpaceManager::~AddrSpaceManager(&this->super_AddrSpaceManager);
  return;
}

Assistant:

Architecture::~Architecture(void)

{				// Delete anything that was allocated
  vector<TypeOp *>::iterator iter;
  TypeOp *t_op;

  for(iter=inst.begin();iter!=inst.end();++iter) {
    t_op = *iter;
    if (t_op != (TypeOp *)0)
      delete t_op;
  }
  for(int4 i=0;i<extra_pool_rules.size();++i)
    delete extra_pool_rules[i];

  delete symboltab;
  for(int4 i=0;i<(int4)printlist.size();++i)
    delete printlist[i];
  delete options;
#ifdef CPUI_STATISTICS
  delete stats;
#endif

  map<string,ProtoModel *>::const_iterator piter;
  for(piter=protoModels.begin();piter!=protoModels.end();++piter)
    delete (*piter).second;

  if (types != (TypeFactory *)0)
    delete types;
  if (translate != (Translate *)0)
    delete translate;
  if (loader != (LoadImage *)0)
    delete loader;
  if (pcodeinjectlib != (PcodeInjectLibrary *)0)
    delete pcodeinjectlib;
  if (commentdb != (CommentDatabase *)0)
    delete commentdb;
  if (cpool != (ConstantPool *)0)
    delete cpool;
  if (context != (ContextDatabase *)0)
    delete context;
}